

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_array_ref.hpp
# Opt level: O2

void __thiscall
boost::
const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
::const_multi_array_ref
          (const_multi_array_ref<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_2UL,_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_**>
           *this,matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 **base,storage_order_type *so,index *index_bases,size_type *extents)

{
  unsigned_long uVar1;
  undefined6 uVar2;
  undefined1 auVar3 [16];
  long local_28 [3];
  
  this->base_ = base;
  uVar1 = (so->ordering_).elems[1];
  (this->storage_).ordering_.elems[0] = (so->ordering_).elems[0];
  (this->storage_).ordering_.elems[1] = uVar1;
  auVar3 = ZEXT816(0) << 0x20;
  uVar2 = *(undefined6 *)&so->field_0x12;
  (this->storage_).ascending_ = (array<bool,_2UL>)(so->ascending_).elems[0];
  *(undefined6 *)&(this->storage_).field_0x12 = uVar2;
  this->origin_offset_ = auVar3._0_8_;
  this->directional_offset_ = auVar3._8_8_;
  if (index_bases == (index *)0x0) {
    *(undefined1 (*) [16])(this->index_base_list_).elems = auVar3;
  }
  else {
    detail::multi_array::copy_n<long_const*,unsigned_long,long*>
              (index_bases,2,(this->index_base_list_).elems);
  }
  if (extents != (size_type *)0x0) {
    const_multi_array_ref<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>**>
    ::init_multi_array_ref<unsigned_long_const*>
              ((const_multi_array_ref<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>**>
                *)this,extents);
    return;
  }
  local_28[0] = 0;
  local_28[1] = 0;
  const_multi_array_ref<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>**>
  ::init_multi_array_ref<long*>
            ((const_multi_array_ref<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>*,2ul,boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>**>
              *)this,local_28);
  return;
}

Assistant:

explicit
  const_multi_array_ref(TPtr base,
                        const storage_order_type& so,
                        const index * index_bases,
                        const size_type* extents) :
    base_(base), storage_(so), origin_offset_(0), directional_offset_(0)
 {
   // If index_bases or extents is null, then initialize the corresponding
   // private data to zeroed lists.
   if(index_bases) {
     boost::detail::multi_array::
       copy_n(index_bases,NumDims,index_base_list_.begin());
   } else {
     std::fill_n(index_base_list_.begin(),NumDims,0);
   }
   if(extents) {
     init_multi_array_ref(extents);
   } else {
     boost::array<index,NumDims> extent_list;
     extent_list.assign(0);
     init_multi_array_ref(extent_list.begin());
   }
 }